

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O1

int EVthin_socket_listen(CManager cm,char **hostname_p,int *port_p)

{
  FILE *__stream;
  int __fd;
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  time_t tVar4;
  pthread_t pVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  int low_bound;
  int sock_opt_val;
  int high_bound;
  sockaddr_in sock_addr;
  uint length;
  char host_name [256];
  int local_174;
  undefined4 local_170;
  int local_16c;
  char **local_168;
  uint *local_160;
  double local_158;
  sockaddr local_14c;
  socklen_t local_13c;
  timespec local_138 [16];
  
  local_170 = 1;
  CMget_port_range(cm,&local_16c,&local_174);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    EVthin_socket_listen_cold_4();
  }
  else {
    local_14c.sa_family = 2;
    local_14c.sa_data[0] = '\0';
    local_14c.sa_data[1] = '\0';
    local_14c.sa_data[2] = '\0';
    local_14c.sa_data[3] = '\0';
    local_14c.sa_data[4] = '\0';
    local_14c.sa_data[5] = '\0';
    iVar1 = setsockopt(__fd,1,2,&local_170,4);
    if (iVar1 == 0) {
      local_168 = hostname_p;
      local_160 = (uint *)port_p;
      tVar4 = time((time_t *)0x0);
      _Var2 = getpid();
      iVar1 = local_16c - local_174;
      srand48(_Var2 + tVar4);
      iVar7 = 0x1e;
      do {
        iVar3 = local_174;
        local_158 = (double)iVar1;
        dVar9 = drand48();
        uVar8 = (int)(dVar9 * local_158) + iVar3;
        local_14c.sa_data._0_2_ = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
        iVar3 = CMtrace_val[2];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(cm,CMConnectionVerbose);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            __stream = (FILE *)cm->CMTrace_file;
            _Var2 = getpid();
            pVar5 = pthread_self();
            fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,local_138);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_138[0].tv_sec,
                    local_138[0].tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"CMSocket trying to bind port %d",(ulong)uVar8);
        }
        fflush((FILE *)cm->CMTrace_file);
        iVar3 = bind(__fd,&local_14c,0x10);
        iVar7 = iVar7 + -1;
        if (iVar3 != -1) {
          iVar7 = 0;
        }
        if (iVar7 * -0x33333333 + 0xccccccccU < 0x33333333) {
          tVar4 = time((time_t *)0x0);
          _Var2 = getpid();
          srand48(_Var2 + tVar4);
        }
        iVar3 = iVar1 * 10;
        if (iVar7 != 0x14) {
          iVar3 = iVar1;
        }
        iVar1 = iVar3 * 10;
        if (iVar7 != 10) {
          iVar1 = iVar3;
        }
      } while (0 < iVar7);
      local_170 = 1;
      iVar1 = setsockopt(__fd,1,2,&local_170,4);
      if (iVar1 == 0) {
        local_13c = 0x10;
        iVar1 = getsockname(__fd,&local_14c,&local_13c);
        if (iVar1 < 0) {
          EVthin_socket_listen_cold_3();
        }
        else {
          iVar1 = listen(__fd,0x400);
          if (iVar1 == 0) {
            CM_fd_add_select(cm,__fd,socket_accept_thin_client,cm,(void *)(long)__fd);
            CMget_qual_hostname(cm,(char *)local_138,0x100);
            pcVar6 = strdup((char *)local_138);
            *local_168 = pcVar6;
            *local_160 = uVar8;
            return 1;
          }
          EVthin_socket_listen_cold_2();
        }
      }
      else {
        perror("Failed to set 2REUSEADDR on INET socket");
      }
    }
    else {
      EVthin_socket_listen_cold_1();
    }
  }
  return 0;
}

Assistant:

extern int
EVthin_socket_listen(CManager cm,  char **hostname_p, int *port_p)
{

    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock;
    int int_port_num = 0;
    u_short port_num = 0;
    char host_name[256];
    int high_bound, low_bound;
    CMget_port_range(cm, &high_bound, &low_bound);

    conn_sock = socket(AF_INET, SOCK_STREAM, 0);
    if (conn_sock == SOCKET_ERROR) {
	fprintf(stderr, "Cannot open INET socket\n");
	return 0;
    }
    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = (unsigned short) (htons(port_num));
    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
		   sizeof(sock_opt_val)) != 0) {
	fprintf(stderr, "Failed to set 1REUSEADDR on INET socket\n");
	return 0;
    }
    {
	long seedval = (long)time(NULL) + (long)getpid();
	/* port num is free.  Constrain to range to standards */
	int size = high_bound - low_bound;
	int tries = 30;
	int result = SOCKET_ERROR;
	srand48(seedval);
	while (tries > 0) {
	    int target = low_bound + (int)(size * drand48());
	    sock_addr.sin_port = htons(target);
	    CMtrace_out(cm, CMConnectionVerbose, "CMSocket trying to bind port %d", target);
	    result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			  sizeof sock_addr);
	    int_port_num = target;
	    tries--;
	    if (result != SOCKET_ERROR) tries = 0;
	    if (tries%5 == 4) {
		/* try reseeding in case we're in sync with another process */
		srand48(time(NULL) + getpid());
	    }
	    if (tries == 20) {
		/* damn, tried a lot, increase the range (This might violate specified range) */
		size *= 10;
	    }
	    if (tries == 10) {
		/* damn, tried a lot more, increase the range (This might violate specified range) */
		size *= 10;
	    }
	}
    }
    /*    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
	     sizeof sock_addr) == SOCKET_ERROR) {
	fprintf(stderr, "Cannot bind INET socket\n");
	return 0;
	}*/
    sock_opt_val = 1;
    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
		   sizeof(sock_opt_val)) != 0) {
	perror("Failed to set 2REUSEADDR on INET socket");
	return 0;
    }
    length = sizeof sock_addr;
    if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	fprintf(stderr, "Cannot get socket name\n");
	return 0;
    }
    /* begin listening for conns and set the backlog */
    if (listen(conn_sock, FD_SETSIZE)) {
	fprintf(stderr, "listen failed\n");
	return 0;
    }
    /* set the port num as one we can be contacted at */
    
    CM_fd_add_select(cm, conn_sock, socket_accept_thin_client,
		    (void *) cm, (void *) (intptr_t)conn_sock);
    

    //    int_port_num = (unsigned short)(ntohs(sock_addr.sin_port));

    CMget_qual_hostname(cm, host_name, sizeof(host_name));
	
    *hostname_p = strdup(host_name);
    *port_p = int_port_num;
    return 1;
}